

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O2

bool __thiscall lunasvg::decodeText(lunasvg *this,string_view input,string *output)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined1 uVar4;
  int base;
  char *pcVar5;
  string_view local_58;
  uint local_44;
  string_view input_local;
  
  pcVar5 = input._M_str;
  input_local._M_str = (char *)input._M_len;
  pcVar5[8] = '\0';
  pcVar5[9] = '\0';
  pcVar5[10] = '\0';
  pcVar5[0xb] = '\0';
  pcVar5[0xc] = '\0';
  pcVar5[0xd] = '\0';
  pcVar5[0xe] = '\0';
  pcVar5[0xf] = '\0';
  **(undefined1 **)pcVar5 = 0;
  while (this != (lunasvg *)0x0) {
    pcVar1 = input_local._M_str + 1;
    input_local._M_len = (size_t)(this + -1);
    if (*input_local._M_str == '&') {
      if (((lunasvg *)input_local._M_len == (lunasvg *)0x0) || (*pcVar1 != '#')) {
        local_58._M_len = 3;
        local_58._M_str = "amp";
        input_local._M_str = pcVar1;
        bVar2 = skipString(&input_local,&local_58);
        if (!bVar2) {
          local_58._M_len = 2;
          local_58._M_str = "lt";
          bVar2 = skipString(&input_local,&local_58);
          if (!bVar2) {
            local_58._M_len = 2;
            local_58._M_str = "gt";
            bVar2 = skipString(&input_local,&local_58);
            if (!bVar2) {
              local_58._M_len = 4;
              local_58._M_str = "quot";
              bVar2 = skipString(&input_local,&local_58);
              if (!bVar2) {
                local_58._M_len = 4;
                local_58._M_str = "apos";
                bVar2 = skipString(&input_local,&local_58);
                if (!bVar2) break;
              }
            }
          }
        }
        std::__cxx11::string::push_back((char)input._M_str);
      }
      else {
        pcVar1 = input_local._M_str + 2;
        base = 10;
        input_local._M_len = (size_t)(this + -2);
        if (((lunasvg *)input_local._M_len != (lunasvg *)0x0) && (*pcVar1 == 'x')) {
          input_local._M_len = (size_t)(this + -3);
          base = 0x10;
          pcVar1 = input_local._M_str + 3;
        }
        input_local._M_str = pcVar1;
        bVar2 = parseInteger<unsigned_int>(&input_local,&local_44,base);
        if (!bVar2) break;
        local_58._M_len = local_58._M_len & 0xffffff0000000000;
        uVar3 = local_44;
        if (local_44 < 0x80) {
LAB_001197ef:
          local_58._M_len = CONCAT71(local_58._M_len._1_7_,(char)uVar3);
        }
        else {
          uVar4 = (undefined1)local_44;
          if (local_44 < 0x800) {
            local_58._M_len =
                 (ulong)(CONCAT61(local_58._M_len._2_6_,uVar4) & 0xffffffffffff3f | 0x80) << 8;
            local_44 = local_44 >> 6;
            uVar3 = (uint)(byte)((byte)local_44 | 0xc0);
            goto LAB_001197ef;
          }
          if (local_44 < 0x10000) {
            local_58._M_len =
                 ((ulong)(CONCAT61(CONCAT51(local_58._M_len._3_5_,uVar4),(char)(local_44 >> 6)) &
                          0xffffffffffff3f | 0x80) & 0xffffffffff3fff) << 8 | 0x800000;
            local_44 = local_44 >> 0xc;
            uVar3 = (uint)(byte)((byte)local_44 | 0xe0);
            goto LAB_001197ef;
          }
          if (local_44 < 0x200000) {
            local_58._M_len =
                 (ulong)(CONCAT61(CONCAT51(CONCAT41(local_58._M_len._4_4_,uVar4),
                                           (char)(local_44 >> 6)),(char)(local_44 >> 0xc)) &
                         0xffffffff3f3f3f | 0x808080) << 8;
            local_44 = local_44 >> 0x12;
            uVar3 = (uint)(byte)((byte)local_44 | 0xf0);
            goto LAB_001197ef;
          }
        }
        std::__cxx11::string::append(pcVar5);
      }
      if ((input_local._M_len == 0) || (*input_local._M_str != ';')) break;
      input_local._M_str = input_local._M_str + 1;
      this = (lunasvg *)(input_local._M_len - 1);
    }
    else {
      input_local._M_str = pcVar1;
      std::__cxx11::string::push_back((char)input._M_str);
      this = (lunasvg *)input_local._M_len;
    }
  }
  return this == (lunasvg *)0x0;
}

Assistant:

inline bool decodeText(std::string_view input, std::string& output)
{
    output.clear();
    while(!input.empty()) {
        auto ch = input.front();
        input.remove_prefix(1);
        if(ch != '&') {
            output.push_back(ch);
            continue;
        }

        if(skipDelimiter(input, '#')) {
            int base = 10;
            if(skipDelimiter(input, 'x'))
                base = 16;
            unsigned int cp;
            if(!parseInteger(input, cp, base))
                return false;
            char c[5] = {0, 0, 0, 0, 0};
            if(cp < 0x80) {
                c[1] = 0;
                c[0] = char(cp);
            } else if(cp < 0x800) {
                c[2] = 0;
                c[1] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[0] = char(cp | 0xC0);
            } else if(cp < 0x10000) {
                c[3] = 0;
                c[2] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[1] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[0] = char(cp | 0xE0);
            } else if(cp < 0x200000) {
                c[4] = 0;
                c[3] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[2] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[1] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[0] = char(cp | 0xF0);
            }

            output.append(c);
        } else {
            if(skipString(input, "amp")) {
                output.push_back('&');
            } else if(skipString(input, "lt")) {
                output.push_back('<');
            } else if(skipString(input, "gt")) {
                output.push_back('>');
            } else if(skipString(input, "quot")) {
                output.push_back('\"');
            } else if(skipString(input, "apos")) {
                output.push_back('\'');
            } else {
                return false;
            }
        }

        if(!skipDelimiter(input, ';')) {
            return false;
        }
    }

    return true;
}